

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

CSVError *
duckdb::CSVError::SniffingError
          (CSVError *__return_storage_ptr__,CSVReaderOptions *options,string *search_space,
          idx_t max_columns_found,SetColumns *set_columns)

{
  ostream *poVar1;
  ostringstream error;
  char local_1f9;
  string local_1f8;
  LinesPerBoundary local_1d8;
  ostringstream local_1c8 [112];
  ios_base local_158 [264];
  string local_50;
  
  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"Error when sniffing file \"",0x1a);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(options->file_path)._M_dataplus._M_p,
                      (options->file_path)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,
             "It was not possible to automatically detect the CSV Parsing dialect/types",0x49);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"The search space used was:",0x1a);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,(search_space->_M_dataplus)._M_p,search_space->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Encoding: ",10);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(options->encoding)._M_dataplus._M_p,
                      (options->encoding)._M_string_length);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Possible fixes:",0xf);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  if ((options->dialect_options).state_machine_options.strict_mode.value == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
               ,0x76);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  if (options->columns_set == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Columns are set as: \"",0x17);
    SetColumns::ToString_abi_cxx11_(&local_1f8,set_columns);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,
                        (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                         (char)local_1f8._M_dataplus._M_p),
                        local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", and they contain: ",0x15);
    SetColumns::Size(set_columns);
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," columns. It does not match the number of columns found by the sniffer: ",
               0x48);
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," Verify the columns parameter is correctly set.",0x2f);
    local_1f9 = '\n';
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1f9,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
        &local_1f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p));
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,
             "* Make sure you are using the correct file encoding. If not, set it (e.g., encoding = \'utf-16\')."
             ,0x60);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  if ((options->dialect_options).state_machine_options.delimiter.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Set delimiter (e.g., delim=\',\')",0x21);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Delimiter is set to \'",0x17);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,
                        (options->dialect_options).state_machine_options.delimiter.value._M_dataplus
                        ._M_p,(options->dialect_options).state_machine_options.delimiter.value.
                              _M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'. Consider unsetting it.",0x19);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  }
  if ((options->dialect_options).state_machine_options.quote.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Set quote (e.g., quote=\'\"\')",0x1d);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Quote is set to \'",0x13);
    local_1f8._M_dataplus._M_p._0_1_ = (options->dialect_options).state_machine_options.quote.value;
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)&local_1f8,1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'. Consider unsetting it.",0x19);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  }
  if ((options->dialect_options).state_machine_options.escape.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Set escape (e.g., escape=\'\"\')",0x1f);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Escape is set to \'",0x14);
    local_1f8._M_dataplus._M_p._0_1_ = (options->dialect_options).state_machine_options.escape.value
    ;
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)&local_1f8,1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'. Consider unsetting it.",0x19);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  }
  if ((options->dialect_options).state_machine_options.comment.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Set comment (e.g., comment=\'#\')",0x21);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"* Comment is set to \'",0x15);
    local_1f8._M_dataplus._M_p._0_1_ =
         (options->dialect_options).state_machine_options.comment.value;
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)&local_1f8,1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'. Consider unsetting it.",0x19);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,1);
  }
  if ((options->dialect_options).skip_rows.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "* Set skip (skip=${n}) to skip ${n} lines at the top of the file",0x40);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  if ((options->ignore_errors).value == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "* Enable ignore errors (ignore_errors=true) to ignore potential errors",0x46);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  if (options->null_padding == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "* Enable null padding (null_padding=true) to pad missing columns with NULL values",
               0x51);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,
             "* Check you are using the correct file compression, otherwise set it (e.g., compression = \'zstd\')"
             ,0x61);
  local_1f8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1f8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,
             "* Be sure that the maximum line size is set to an appropriate value, otherwise set it (e.g., max_line_size=10000000)"
             ,0x74);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,anon_var_dwarf_4f000dd + 8,1);
  ::std::__cxx11::stringbuf::str();
  LinesPerBoundary::LinesPerBoundary(&local_1d8);
  CSVError(__return_storage_ptr__,&local_50,SNIFFING,local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
  ::std::ios_base::~ios_base(local_158);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::SniffingError(const CSVReaderOptions &options, const string &search_space, idx_t max_columns_found,
                                 SetColumns &set_columns) {
	std::ostringstream error;
	// 1. Which file
	error << "Error when sniffing file \"" << options.file_path << "\"." << '\n';
	// 2. What's the error
	error << "It was not possible to automatically detect the CSV Parsing dialect/types" << '\n';

	// 2. What was the search space?
	error << "The search space used was:" << '\n';
	error << search_space;
	error << "Encoding: " << options.encoding << '\n';
	// 3. Suggest how to fix it!
	error << "Possible fixes:" << '\n';
	// 3.0 Inform the user about the strict_mode
	// 3.1 Inform the reader of the dialect
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		error << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not comply with "
		         "the CSV standard."
		      << '\n';
	}
	if (options.columns_set) {
		// If columns are set, suggest to either unset it or validate that it matches the schema
		error << "* Columns are set as: \"" << set_columns.ToString() << "\", and they contain: " << set_columns.Size()
		      << " columns. It does not match the number of columns found by the sniffer: " << max_columns_found << "."
		      << " Verify the columns parameter is correctly set." << '\n';
	}
	// 3.0.1 Inform the user about encoding
	error << "* Make sure you are using the correct file encoding. If not, set it (e.g., encoding = 'utf-16')." << '\n';
	// 3.1 Inform the reader of the dialect
	// delimiter
	if (!options.dialect_options.state_machine_options.delimiter.IsSetByUser()) {
		error << "* Set delimiter (e.g., delim=\',\')" << '\n';
	} else {
		error << "* Delimiter is set to \'" << options.dialect_options.state_machine_options.delimiter.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// quote
	if (!options.dialect_options.state_machine_options.quote.IsSetByUser()) {
		error << "* Set quote (e.g., quote=\'\"\')" << '\n';
	} else {
		error << "* Quote is set to \'" << options.dialect_options.state_machine_options.quote.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// escape
	if (!options.dialect_options.state_machine_options.escape.IsSetByUser()) {
		error << "* Set escape (e.g., escape=\'\"\')" << '\n';
	} else {
		error << "* Escape is set to \'" << options.dialect_options.state_machine_options.escape.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// comment
	if (!options.dialect_options.state_machine_options.comment.IsSetByUser()) {
		error << "* Set comment (e.g., comment=\'#\')" << '\n';
	} else {
		error << "* Comment is set to \'" << options.dialect_options.state_machine_options.comment.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// 3.2 skip_rows
	if (!options.dialect_options.skip_rows.IsSetByUser()) {
		error << "* Set skip (skip=${n}) to skip ${n} lines at the top of the file" << '\n';
	}
	// 3.3 ignore_errors
	if (!options.ignore_errors.GetValue()) {
		error << "* Enable ignore errors (ignore_errors=true) to ignore potential errors" << '\n';
	}
	// 3.4 null_padding
	if (!options.null_padding) {
		error << "* Enable null padding (null_padding=true) to pad missing columns with NULL values" << '\n';
	}
	error << "* Check you are using the correct file compression, otherwise set it (e.g., compression = \'zstd\')"
	      << '\n';
	error << "* Be sure that the maximum line size is set to an appropriate value, otherwise set it (e.g., "
	         "max_line_size=10000000)"
	      << "\n";
	return CSVError(error.str(), SNIFFING, {});
}